

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O2

TString * luaS_newlstr(lua_State *L,char *str,size_t l)

{
  TString *pTVar1;
  
  if (l < 0x29) {
    pTVar1 = internshrstr(L,str,l);
    return pTVar1;
  }
  if (l < 0x7fffffffffffffcf) {
    pTVar1 = luaS_createlngstrobj(L,l);
    memcpy(pTVar1->contents,str,l);
    return pTVar1;
  }
  luaM_toobig(L);
}

Assistant:

TString *luaS_newlstr (lua_State *L, const char *str, size_t l) {
  if (l <= LUAI_MAXSHORTLEN)  /* short string? */
    return internshrstr(L, str, l);
  else {
    TString *ts;
    if (l_unlikely(l * sizeof(char) >= (MAX_SIZE - sizeof(TString))))
      luaM_toobig(L);
    ts = luaS_createlngstrobj(L, l);
    memcpy(getlngstr(ts), str, l * sizeof(char));
    return ts;
  }
}